

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace::~IfcPolygonalBoundedHalfSpace
          (IfcPolygonalBoundedHalfSpace *this)

{
  ~IfcPolygonalBoundedHalfSpace((IfcPolygonalBoundedHalfSpace *)&this[-1].PolygonalBoundary);
  return;
}

Assistant:

IfcPolygonalBoundedHalfSpace() : Object("IfcPolygonalBoundedHalfSpace") {}